

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O1

int serverAtomicRead(void *fd,void *buffer,int length)

{
  uint uVar1;
  char *pcVar2;
  double dVar3;
  int junk_errno;
  char *junk_result_str;
  uint local_1c;
  char *local_18;
  
  local_18 = (char *)0x0;
  uVar1 = (*ffs_server_read_func)(fd,buffer,(long)length,(int *)&local_1c,&local_18);
  pcVar2 = getenv("BAD_CLIENT");
  if (pcVar2 != (char *)0x0) {
    dVar3 = drand48();
    if (dVar3 < 0.0001) {
      sleep(600);
    }
  }
  if (uVar1 != length) {
    if (format_server_verbose == -1) {
      pcVar2 = getenv("FORMAT_SERVER_VERBOSE");
      format_server_verbose = (int)(pcVar2 != (char *)0x0);
    }
    if (format_server_verbose != 0) {
      printf("server read error, return is %d, length %d, errno %d\n",(ulong)uVar1,
             (ulong)(uint)length,(ulong)local_1c);
      if (local_18 != (char *)0x0) {
        printf("result_string is %s\n");
      }
    }
  }
  return uVar1;
}

Assistant:

extern int
serverAtomicRead(void *fd, void *buffer, int length)
{
    char *junk_result_str = NULL;
    int junk_errno;
    int ret = ffs_server_read_func(fd, buffer, length, &junk_errno,
				  &junk_result_str);

    if (getenv("BAD_CLIENT") && (drand48() < 0.0001)) sleep(600);
    if (ret != length) {
	if (get_format_server_verbose()) {
	    printf("server read error, return is %d, length %d, errno %d\n",
		   ret, length, junk_errno);
	    if (junk_result_str != NULL) {
		printf("result_string is %s\n", junk_result_str);
	    }
	}
    }
    return ret;
}